

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::FieldDescriptorProto::SharedCtor(FieldDescriptorProto *this,Arena *arena)

{
  Impl_::Impl_((Impl_ *)&this->field_0);
  (this->field_0)._impl_.options_ = (FieldOptions *)0x0;
  *(undefined8 *)((long)&this->field_0 + 0x38) = 0;
  (this->field_0)._impl_.proto3_optional_ = false;
  return;
}

Assistant:

inline void FieldDescriptorProto::SharedCtor(::_pb::Arena* PROTOBUF_NULLABLE arena) {
  new (&_impl_) Impl_(internal_visibility(), arena);
  ::memset(reinterpret_cast<char *>(&_impl_) +
               offsetof(Impl_, options_),
           0,
           offsetof(Impl_, proto3_optional_) -
               offsetof(Impl_, options_) +
               sizeof(Impl_::proto3_optional_));
}